

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O0

int evutil_gettime_monotonic_(evutil_monotonic_timer *base,timeval *tp)

{
  int iVar1;
  undefined1 local_30 [8];
  timespec ts;
  timeval *tp_local;
  evutil_monotonic_timer *base_local;
  
  ts.tv_nsec = (__syscall_slong_t)tp;
  if (base->monotonic_clock < 0) {
    iVar1 = gettimeofday((timeval *)tp,(__timezone_ptr_t)0x0);
    if (iVar1 < 0) {
      base_local._4_4_ = -1;
    }
    else {
      adjust_monotonic_time(base,(timeval *)ts.tv_nsec);
      base_local._4_4_ = 0;
    }
  }
  else {
    iVar1 = clock_gettime(base->monotonic_clock,(timespec *)local_30);
    if (iVar1 == -1) {
      base_local._4_4_ = -1;
    }
    else {
      *(undefined1 (*) [8])ts.tv_nsec = local_30;
      *(long *)(ts.tv_nsec + 8) = ts.tv_sec / 1000;
      base_local._4_4_ = 0;
    }
  }
  return base_local._4_4_;
}

Assistant:

int
evutil_gettime_monotonic_(struct evutil_monotonic_timer *base,
    struct timeval *tp)
{
	struct timespec ts;

	if (base->monotonic_clock < 0) {
		if (evutil_gettimeofday(tp, NULL) < 0)
			return -1;
		adjust_monotonic_time(base, tp);
		return 0;
	}

	if (clock_gettime(base->monotonic_clock, &ts) == -1)
		return -1;
	tp->tv_sec = ts.tv_sec;
	tp->tv_usec = ts.tv_nsec / 1000;

	return 0;
}